

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void highbd_dc_top_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = 0;
  if (0 < bw) {
    uVar4 = (ulong)(uint)bw;
  }
  iVar1 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)above[uVar2];
  }
  iVar3 = 0;
  if (bh < 1) {
    bh = 0;
  }
  for (; iVar3 != bh; iVar3 = iVar3 + 1) {
    for (uVar2 = 0; (uint)bw != uVar2; uVar2 = uVar2 + 1) {
      dst[uVar2] = (uint16_t)((int)(iVar1 + ((uint)bw >> 1)) / bw);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_dc_top_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)left;
  (void)bd;

  for (i = 0; i < bw; i++) sum += above[i];
  expected_dc = (sum + (bw >> 1)) / bw;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}